

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O1

void bitset_shift_left(bitset_t *bitset,size_t s)

{
  size_t sVar1;
  uint64_t *puVar2;
  byte bVar3;
  uint64_t *puVar4;
  ulong uVar5;
  size_t i;
  ulong newarraysize;
  
  uVar5 = s >> 6;
  sVar1 = bitset->arraysize;
  newarraysize = uVar5 + sVar1;
  bVar3 = (byte)s;
  if ((s & 0x3f) == 0) {
    bitset_resize(bitset,newarraysize,false);
    if (uVar5 < newarraysize) {
      puVar2 = bitset->array;
      puVar4 = puVar2 + sVar1;
      do {
        puVar4 = puVar4 + -1;
        puVar2[newarraysize - 1] = *puVar4;
        newarraysize = newarraysize - 1;
      } while (uVar5 < newarraysize);
    }
  }
  else {
    bitset_resize(bitset,newarraysize + 1,true);
    puVar4 = bitset->array;
    puVar4[newarraysize] = puVar4[sVar1 - 1] >> (-(bVar3 & 0x3f) & 0x3f);
    if (uVar5 + 2 <= newarraysize) {
      puVar2 = puVar4 + sVar1;
      do {
        puVar4[newarraysize - 1] =
             puVar2[-2] >> (0x40 - (bVar3 & 0x3f) & 0x3f) | puVar2[-1] << (bVar3 & 0x3f);
        newarraysize = newarraysize - 1;
        puVar2 = puVar2 + -1;
      } while (uVar5 + 2 <= newarraysize);
    }
    puVar4[uVar5] = *puVar4 << (bVar3 & 0x3f);
  }
  if (s < 0x40) {
    return;
  }
  memset(bitset->array,0,uVar5 << 3);
  return;
}

Assistant:

void bitset_shift_left(bitset_t *bitset, size_t s) {
    size_t extra_words = s / 64;
    int inword_shift = s % 64;
    size_t as = bitset->arraysize;
    if (inword_shift == 0) {
        bitset_resize(bitset, as + extra_words, false);
        // could be done with a memmove
        for (size_t i = as + extra_words; i > extra_words; i--) {
            bitset->array[i - 1] = bitset->array[i - 1 - extra_words];
        }
    } else {
        bitset_resize(bitset, as + extra_words + 1, true);
        bitset->array[as + extra_words] =
            bitset->array[as - 1] >> (64 - inword_shift);
        for (size_t i = as + extra_words; i >= extra_words + 2; i--) {
            bitset->array[i - 1] =
                (bitset->array[i - 1 - extra_words] << inword_shift) |
                (bitset->array[i - 2 - extra_words] >> (64 - inword_shift));
        }
        bitset->array[extra_words] = bitset->array[0] << inword_shift;
    }
    for (size_t i = 0; i < extra_words; i++) {
        bitset->array[i] = 0;
    }
}